

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O2

int __thiscall
CVmHashEntryDict::add_entry(CVmHashEntryDict *this,vm_obj_id_t obj,vm_prop_id_t prop,int from_image)

{
  vm_dict_entry **ppvVar1;
  vm_dict_entry *pvVar2;
  vm_dict_entry *pvVar3;
  
  pvVar3 = (vm_dict_entry *)0x0;
  ppvVar1 = &this->list_;
  while( true ) {
    pvVar2 = *ppvVar1;
    if (pvVar2 == (vm_dict_entry *)0x0) {
      pvVar2 = (vm_dict_entry *)operator_new(0x18);
      pvVar2->obj_ = obj;
      pvVar2->prop_ = prop;
      pvVar2->from_image_ = from_image;
      ppvVar1 = &pvVar3->nxt_;
      if (pvVar3 == (vm_dict_entry *)0x0) {
        ppvVar1 = &this->list_;
      }
      pvVar2->nxt_ = *ppvVar1;
      *ppvVar1 = pvVar2;
      return 1;
    }
    if (pvVar2->obj_ == obj && pvVar2->prop_ == prop) break;
    if (pvVar2->prop_ == prop) {
      pvVar3 = pvVar2;
    }
    ppvVar1 = &pvVar2->nxt_;
  }
  return 0;
}

Assistant:

int add_entry(vm_obj_id_t obj, vm_prop_id_t prop, int from_image)
    {
        vm_dict_entry *entry;
        vm_dict_entry *prv;

        /* 
         *   check to see if this entry is already in our list - if it is,
         *   don't bother adding the redundant definition 
         */
        for (prv = 0, entry = list_ ; entry != 0 ; entry = entry->nxt_)
        {
            /* 
             *   if this entry matches the object ID and property ID,
             *   ignore the addition 
             */
            if (entry->obj_ == obj && entry->prop_ == prop)
                return FALSE;

            /* 
             *   if this entry matches the property, remember it as the
             *   insertion point, so that we keep all definitions for the
             *   same word with the same property together in the list 
             */
            if (entry->prop_ == prop)
                prv = entry;
        }

        /* create a list entry */
        entry = new vm_dict_entry(obj, prop, from_image);

        /* 
         *   link it in after the insertion point, or at the head of our
         *   list if we didn't find any other insertion point 
         */
        if (prv != 0)
        {
            /* we found an insertion point - link it in */
            entry->nxt_ = prv->nxt_;
            prv->nxt_ = entry;
        }
        else
        {
            /* no insertion point - link it at the head of our list */
            entry->nxt_ = list_;
            list_ = entry;
        }

        /* we added the entry */
        return TRUE;
    }